

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O1

void __thiscall
cali::Caliper::push_snapshot_replace
          (Caliper *this,ChannelBody *chB,SnapshotView trigger_info,Entry *target)

{
  SnapshotBuilder *rec;
  size_t *psVar1;
  int iVar2;
  ThreadData *pTVar3;
  GlobalData *pGVar4;
  ThreadData *pTVar5;
  size_t sVar6;
  pointer pfVar7;
  Entry *pEVar8;
  SnapshotView __args_1;
  size_t sVar9;
  ChannelBody *pCVar10;
  int iVar11;
  unsigned_long __n2;
  ulong uVar12;
  ulong uVar13;
  function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)> *f;
  pointer this_00;
  SnapshotView __args_2;
  SnapshotView local_68;
  pthread_mutex_t *local_58;
  ThreadData *local_50;
  ChannelBody *local_48;
  Entry *local_40;
  Caliper *local_38;
  
  local_68.m_len = trigger_info.m_len;
  local_68.m_data = trigger_info.m_data;
  local_50 = this->sT;
  (local_50->lock).m_lock = (local_50->lock).m_lock + 1;
  (local_50->snapshot).m_builder.m_data = (local_50->snapshot).m_data;
  (local_50->snapshot).m_builder.m_capacity = 0x78;
  (local_50->snapshot).m_builder.m_len = 0;
  (local_50->snapshot).m_builder.m_skipped = 0;
  pTVar3 = this->sT;
  rec = &(pTVar3->snapshot).m_builder;
  local_40 = target;
  Blackboard::snapshot(&pTVar3->thread_blackboard,rec);
  pGVar4 = this->sG;
  pTVar5 = this->sT;
  iVar2 = (pGVar4->process_blackboard).ucount.super___atomic_base<int>._M_i;
  local_48 = chB;
  if (pTVar5->process_bb_count < iVar2) {
    local_58 = (pthread_mutex_t *)&pGVar4->process_blackboard_lock;
    (pTVar5->process_snapshot).m_builder.m_data = (pTVar5->process_snapshot).m_data;
    (pTVar5->process_snapshot).m_builder.m_capacity = 0x78;
    (pTVar5->process_snapshot).m_builder.m_len = 0;
    (pTVar5->process_snapshot).m_builder.m_skipped = 0;
    iVar11 = pthread_mutex_lock(local_58);
    if (iVar11 != 0) {
      std::__throw_system_error(iVar11);
    }
    Blackboard::snapshot(&pGVar4->process_blackboard,&(pTVar5->process_snapshot).m_builder);
    pTVar5->process_bb_count = iVar2;
    pthread_mutex_unlock(local_58);
  }
  uVar13 = (this->sT->process_snapshot).m_builder.m_len;
  sVar6 = (pTVar3->snapshot).m_builder.m_len;
  uVar12 = (pTVar3->snapshot).m_builder.m_capacity - sVar6;
  if (uVar13 <= uVar12) {
    uVar12 = uVar13;
  }
  if (uVar12 != 0) {
    memmove(rec->m_data + sVar6,(this->sT->process_snapshot).m_builder.m_data,uVar12 * 0x18);
  }
  psVar1 = &(pTVar3->snapshot).m_builder.m_len;
  *psVar1 = *psVar1 + uVar12;
  psVar1 = &(pTVar3->snapshot).m_builder.m_skipped;
  *psVar1 = *psVar1 + (uVar13 - uVar12);
  SnapshotBuilder::remove(rec,(char *)local_40);
  pCVar10 = local_48;
  sVar9 = local_68.m_len;
  sVar6 = (pTVar3->snapshot).m_builder.m_len;
  uVar13 = (pTVar3->snapshot).m_builder.m_capacity - sVar6;
  if (local_68.m_len <= uVar13) {
    uVar13 = local_68.m_len;
  }
  if (uVar13 != 0) {
    memmove(rec->m_data + sVar6,local_68.m_data,uVar13 * 0x18);
  }
  psVar1 = &(pTVar3->snapshot).m_builder.m_len;
  *psVar1 = *psVar1 + uVar13;
  psVar1 = &(pTVar3->snapshot).m_builder.m_skipped;
  *psVar1 = *psVar1 + (sVar9 - uVar13);
  local_38 = this;
  util::callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)>::operator()
            ((callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)> *)
             &(pCVar10->events).snapshot,&local_38,&local_68,rec);
  this_00 = (pCVar10->events).process_snapshot.mCb.
            super__Vector_base<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pfVar7 = (pCVar10->events).process_snapshot.mCb.
           super__Vector_base<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pfVar7) {
    pEVar8 = (pTVar3->snapshot).m_builder.m_data;
    sVar6 = (pTVar3->snapshot).m_builder.m_len;
    do {
      __args_1.m_len = local_68.m_len;
      __args_1.m_data = local_68.m_data;
      __args_2.m_len = sVar6;
      __args_2.m_data = pEVar8;
      std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>::operator()
                (this_00,this,__args_1,__args_2);
      this_00 = this_00 + 1;
    } while (this_00 != pfVar7);
  }
  (local_50->lock).m_lock = (local_50->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::push_snapshot_replace(ChannelBody* chB, SnapshotView trigger_info, const Entry& target)
{
    std::lock_guard<::siglock> g(sT->lock);

    sT->snapshot.reset();
    SnapshotBuilder& rec = sT->snapshot.builder();

    sT->thread_blackboard.snapshot(rec);
    sT->update_process_snapshot(sG->process_blackboard, sG->process_blackboard_lock);
    rec.append(sT->process_snapshot.view());

    // remove/replace target entry from blackboard snapshot
    rec.remove(target);
    rec.append(trigger_info);

    chB->events.snapshot(this, trigger_info, rec);
    chB->events.process_snapshot(this, trigger_info, rec.view());
}